

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall
ir_expression::ir_expression
          (ir_expression *this,int op,glsl_type *type,ir_rvalue *op0,ir_rvalue *op1,ir_rvalue *op2,
          ir_rvalue *op3)

{
  uint local_4c;
  uint local_48;
  uint i_1;
  uint i;
  ir_rvalue *op2_local;
  ir_rvalue *op1_local;
  ir_rvalue *op0_local;
  glsl_type *type_local;
  int op_local;
  ir_expression *this_local;
  
  ir_rvalue::ir_rvalue(&this->super_ir_rvalue,ir_type_expression);
  (this->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction =
       (_func_int **)&PTR__ir_expression_002fc8e8;
  (this->super_ir_rvalue).type = type;
  this->operation = op;
  this->operands[0] = op0;
  this->operands[1] = op1;
  this->operands[2] = op2;
  this->operands[3] = op3;
  init_num_operands(this);
  local_48 = (uint)this->num_operands;
  while( true ) {
    if (3 < local_48) {
      local_4c = 0;
      while( true ) {
        if (this->num_operands <= local_4c) {
          return;
        }
        if (this->operands[local_4c] == (ir_rvalue *)0x0) break;
        local_4c = local_4c + 1;
      }
      __assert_fail("this->operands[i] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                    ,0xd6,
                    "ir_expression::ir_expression(int, const struct glsl_type *, ir_rvalue *, ir_rvalue *, ir_rvalue *, ir_rvalue *)"
                   );
    }
    if (this->operands[local_48] != (ir_rvalue *)0x0) break;
    local_48 = local_48 + 1;
  }
  __assert_fail("this->operands[i] == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                ,0xd2,
                "ir_expression::ir_expression(int, const struct glsl_type *, ir_rvalue *, ir_rvalue *, ir_rvalue *, ir_rvalue *)"
               );
}

Assistant:

ir_expression::ir_expression(int op, const struct glsl_type *type,
			     ir_rvalue *op0, ir_rvalue *op1,
			     ir_rvalue *op2, ir_rvalue *op3)
   : ir_rvalue(ir_type_expression)
{
   this->type = type;
   this->operation = ir_expression_operation(op);
   this->operands[0] = op0;
   this->operands[1] = op1;
   this->operands[2] = op2;
   this->operands[3] = op3;
   init_num_operands();

#ifndef NDEBUG
   for (unsigned i = num_operands; i < 4; i++) {
      assert(this->operands[i] == NULL);
   }

   for (unsigned i = 0; i < num_operands; i++) {
      assert(this->operands[i] != NULL);
   }
#endif
}